

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Action::~Action(Action *this)

{
  Action *this_local;
  
  this->_vptr_Action = (_func_int **)&PTR__Action_003b0e80;
  std::__cxx11::string::~string((string *)&this->name);
  Var::~Var(&this->module_var);
  return;
}

Assistant:

virtual ~Action() = default;